

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_functions.h
# Opt level: O0

bool __thiscall sliding_puzzle::SlidingPuzzleState::Compare::operator()(Compare *this,Ptr *a,Ptr *b)

{
  code *pcVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  reference __x;
  reference __y;
  int local_2c;
  int i;
  Ptr *b_local;
  Ptr *a_local;
  Compare *this_local;
  
  local_2c = 0;
  while( true ) {
    peVar3 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)a);
    sVar4 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&peVar3->state_);
    if (sVar4 <= (ulong)(long)local_2c) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    peVar3 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)a);
    __x = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[](&peVar3->state_,(long)local_2c);
    peVar3 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)b);
    __y = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[](&peVar3->state_,(long)local_2c);
    bVar2 = std::operator!=(__x,__y);
    if (bVar2) break;
    peVar3 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)a);
    sVar4 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&peVar3->state_);
    if ((long)local_2c == sVar4 - 1) {
      return true;
    }
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

bool operator()(const Ptr& a,
                    const Ptr& b) const
    {
      for (int i=0; i<a->state_.size(); ++i)
      {
        if (a->state_[i] != b->state_[i])
        {
          return false;
        }
        if (i == a->state_.size()-1)
        {
          return true;
        }
      }
    }